

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_note.cpp
# Opt level: O1

void __thiscall BmsNoteManager::SRandom(BmsNoteManager *this,uint seed,int s,int e)

{
  int iVar1;
  _Rb_tree_color bar;
  undefined8 uVar2;
  BmsWord BVar3;
  uint uVar4;
  undefined4 uVar5;
  BmsNoteManager *pBVar6;
  char cVar7;
  int iVar8;
  int iVar9;
  BmsNote *pBVar10;
  mapped_type *pmVar11;
  _Base_ptr p_Var12;
  BmsNote *pBVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  _Rb_tree<int,_std::pair<const_int,_BmsNote>,_std::_Select1st<std::pair<const_int,_BmsNote>_>,_std::less<int>,_std::allocator<std::pair<const_int,_BmsNote>_>_>
  *this_00;
  int iVar17;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_BmsNote>_>,_std::_Rb_tree_iterator<std::pair<const_int,_BmsNote>_>_>
  pVar18;
  BmsNote currentnote;
  bool iscurrent [20];
  bool isln [20];
  set<int,_std::less<int>,_std::allocator<int>_> notemap;
  BmsNote currentrow [20];
  BmsNote local_368;
  BmsNoteManager *local_348;
  _Rb_tree<int,_std::pair<const_int,_BmsNote>,_std::_Select1st<std::pair<const_int,_BmsNote>_>,_std::less<int>,_std::allocator<std::pair<const_int,_BmsNote>_>_>
  *local_340;
  long local_338;
  _Rb_tree_node_base *local_330;
  char local_328 [32];
  char local_308 [32];
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_2e8;
  BmsNote aBStack_2b8 [20];
  
  srand(seed);
  iVar17 = e - s;
  local_2e8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_2e8._M_impl.super__Rb_tree_header._M_header;
  local_2e8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  lVar16 = 0;
  local_2e8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2e8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2e8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_2e8._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    BmsNoteLane::GetNoteExistBar
              ((BmsNoteLane *)(&this->lanes_[0].notes_ + lVar16),
               (set<int,_std::less<int>,_std::allocator<int>_> *)&local_2e8);
    lVar16 = lVar16 + 0x30;
  } while (lVar16 != 0x3c0);
  local_308[0] = '\0';
  local_308[1] = '\0';
  local_308[2] = '\0';
  local_308[3] = '\0';
  local_308[4] = '\0';
  local_308[5] = '\0';
  local_308[6] = '\0';
  local_308[7] = '\0';
  local_308[8] = '\0';
  local_308[9] = '\0';
  local_308[10] = '\0';
  local_308[0xb] = '\0';
  local_308[0xc] = '\0';
  local_308[0xd] = '\0';
  local_308[0xe] = '\0';
  local_308[0xf] = '\0';
  local_308[0x10] = '\0';
  local_308[0x11] = '\0';
  local_308[0x12] = '\0';
  local_308[0x13] = '\0';
  if ((_Rb_tree_header *)local_2e8._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_2e8._M_impl.super__Rb_tree_header) {
    local_338 = (long)s;
    iVar15 = -1;
    if (-1 < iVar17) {
      iVar15 = iVar17;
    }
    pBVar10 = aBStack_2b8 + local_338;
    iVar14 = (e + 1) - s;
    local_340 = (_Rb_tree<int,_std::pair<const_int,_BmsNote>,_std::_Select1st<std::pair<const_int,_BmsNote>_>,_std::less<int>,_std::allocator<std::pair<const_int,_BmsNote>_>_>
                 *)(this->lanes_ + local_338);
    p_Var12 = local_2e8._M_impl.super__Rb_tree_header._M_header._M_left;
    local_348 = this;
    do {
      pBVar6 = local_348;
      bar = p_Var12[1]._M_color;
      local_328[0] = '\0';
      local_328[1] = '\0';
      local_328[2] = '\0';
      local_328[3] = '\0';
      local_328[4] = '\0';
      local_328[5] = '\0';
      local_328[6] = '\0';
      local_328[7] = '\0';
      local_328[8] = '\0';
      local_328[9] = '\0';
      local_328[10] = '\0';
      local_328[0xb] = '\0';
      local_328[0xc] = '\0';
      local_328[0xd] = '\0';
      local_328[0xe] = '\0';
      local_328[0xf] = '\0';
      local_328[0x10] = '\0';
      local_328[0x11] = '\0';
      local_328[0x12] = '\0';
      local_328[0x13] = '\0';
      lVar16 = 0;
      do {
        BmsNote::BmsNote((BmsNote *)((long)&aBStack_2b8[0].type + lVar16));
        lVar16 = lVar16 + 0x20;
      } while (lVar16 != 0x280);
      pBVar13 = pBVar10;
      iVar8 = iVar14;
      if (s <= e) {
        do {
          pBVar13->type = 0;
          pBVar13 = pBVar13 + 1;
          iVar8 = iVar8 + -1;
        } while (iVar8 != 0);
      }
      lVar16 = local_338;
      local_330 = p_Var12;
      if (s <= e) {
        do {
          BmsNoteLane::Get(&local_368,pBVar6->lanes_ + lVar16,bar);
          if (local_368.type != _S_red) {
            iVar9 = rand();
            iVar8 = iVar15 + 2;
            while( true ) {
              iVar9 = iVar9 % (iVar17 + 1);
              iVar1 = iVar9 + s;
              if ((local_308[iVar1] == '\0') && (local_328[iVar1] != '\x01')) break;
              iVar9 = iVar9 + 1;
              iVar8 = iVar8 + -1;
              if (iVar8 == 0) {
                __assert_fail("attempt <= keycount",
                              "/workspace/llm4binary/github/license_c_cmakelists/kuna[P]bmsbelplus/bmsbel/bms_note.cpp"
                              ,0x11b,"void BmsNoteManager::SRandom(unsigned int, int, int)");
              }
            }
            *(ulong *)&aBStack_2b8[iVar1].field_0xc = CONCAT44(local_368.pos._0_4_,local_368._12_4_)
            ;
            *(undefined8 *)((long)&aBStack_2b8[iVar1].pos + 4) = local_368._20_8_;
            aBStack_2b8[iVar1].type = local_368.type;
            aBStack_2b8[iVar1].value = (BmsWord)local_368.value.value_;
            *(ulong *)&aBStack_2b8[iVar1].time = CONCAT44(local_368._12_4_,local_368.time);
            if (local_368.type == 2) {
              cVar7 = '\x01';
LAB_0012fb7a:
              local_308[iVar1] = cVar7;
            }
            else if (local_368.type == 3) {
              cVar7 = '\0';
              goto LAB_0012fb7a;
            }
            local_328[iVar1] = '\x01';
          }
          BmsWord::~BmsWord(&local_368.value);
          lVar16 = lVar16 + 1;
        } while (e + 1 != (int)lVar16);
      }
      pBVar13 = pBVar10;
      this_00 = local_340;
      iVar8 = iVar14;
      if (s <= e) {
        do {
          local_368.type = bar;
          pVar18 = std::
                   _Rb_tree<int,_std::pair<const_int,_BmsNote>,_std::_Select1st<std::pair<const_int,_BmsNote>_>,_std::less<int>,_std::allocator<std::pair<const_int,_BmsNote>_>_>
                   ::equal_range(this_00,&local_368.type);
          std::
          _Rb_tree<int,_std::pair<const_int,_BmsNote>,_std::_Select1st<std::pair<const_int,_BmsNote>_>,_std::less<int>,_std::allocator<std::pair<const_int,_BmsNote>_>_>
          ::_M_erase_aux(this_00,(_Base_ptr)pVar18.first._M_node,(_Base_ptr)pVar18.second._M_node);
          if (pBVar13->type != 0) {
            local_368.type = bar;
            pmVar11 = std::
                      map<int,_BmsNote,_std::less<int>,_std::allocator<std::pair<const_int,_BmsNote>_>_>
                      ::operator[]((map<int,_BmsNote,_std::less<int>,_std::allocator<std::pair<const_int,_BmsNote>_>_>
                                    *)this_00,&local_368.type);
            iVar9 = pBVar13->type;
            BVar3.value_ = (pBVar13->value).value_;
            uVar4 = pBVar13->time;
            uVar5 = *(undefined4 *)&pBVar13->field_0xc;
            uVar2 = *(undefined8 *)((long)&pBVar13->pos + 4);
            *(undefined8 *)&pmVar11->field_0xc = *(undefined8 *)&pBVar13->field_0xc;
            *(undefined8 *)((long)&pmVar11->pos + 4) = uVar2;
            pmVar11->type = iVar9;
            pmVar11->value = (BmsWord)BVar3.value_;
            pmVar11->time = uVar4;
            *(undefined4 *)&pmVar11->field_0xc = uVar5;
          }
          this_00 = this_00 + 0x30;
          pBVar13 = pBVar13 + 1;
          iVar8 = iVar8 + -1;
        } while (iVar8 != 0);
      }
      lVar16 = 0x264;
      do {
        BmsWord::~BmsWord((BmsWord *)((long)&aBStack_2b8[0].type + lVar16));
        lVar16 = lVar16 + -0x20;
      } while (lVar16 != -0x1c);
      p_Var12 = (_Base_ptr)std::_Rb_tree_increment(local_330);
    } while ((_Rb_tree_header *)p_Var12 != &local_2e8._M_impl.super__Rb_tree_header);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_2e8);
  return;
}

Assistant:

void BmsNoteManager::SRandom(unsigned int seed, int s, int e) {
	// similar to HRandom
	// prepare
	srand(seed);
	int keycount = e - s + 1;
	int failure = 0;			// failed notecount to randomize
	std::set<barindex> notemap;
	GetNoteExistBar(notemap);
	// start to iterate all bars
	bool isprev[_MAX_NOTE_LANE] = { false, };	// is there any note placed previously?
	bool isln[_MAX_NOTE_LANE] = { false, };		// is there occupying longnote currently?
	for (auto it = notemap.begin(); it != notemap.end(); ++it) {
		barindex row = *it;
		bool iscurrent[_MAX_NOTE_LANE] = { false, };
		BmsNote currentrow[_MAX_NOTE_LANE];
		int attempt = 0;
		// initalize row data
		for (int c = s; c <= e; c++) {
			currentrow[c].type = BmsNote::NOTE_NONE;
		}
		// make new row data
		for (int c = s; c <= e; c++) {
			attempt = 0;
			// check previous note data to check valid
			BmsNote currentnote = lanes_[c].Get(row);
			if (currentnote.type == BmsNote::NOTE_NONE) continue;

			/*
			 * find new lane to place note
			 * only difference(from HRANDOM) is here:
			 * we don't check isprev[] (is previously note existed?)
			 */
			int newlane = rand() % keycount + s;
			while (isln[newlane] || iscurrent[newlane]) {
				newlane = (newlane - s + 1) % keycount + s;
				attempt++;
				_ASSERT(attempt <= keycount);	// this shouldn't happen
			}
			// copy previous note data to new temp row
			currentrow[newlane] = currentnote;
			switch (currentnote.type) {
			case BmsNote::NOTE_LNSTART:
				isln[newlane] = true;
				break;
			case BmsNote::NOTE_LNEND:
				isln[newlane] = false;
				break;
			}
			iscurrent[newlane] = true;
		}
		// copy
		for (int c = s; c <= e; c++) {
			lanes_[c].Delete(row);
			if (currentrow[c].type != BmsNote::NOTE_NONE) 
				lanes_[c].Set(row, currentrow[c]);
		}
		memcpy(isprev, iscurrent, sizeof(isprev));
	}
}